

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O2

ssize_t bsplib::UIntSerialize<unsigned_long>::write(int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  long lVar2;
  undefined4 in_register_0000003c;
  ulong uVar3;
  
  lVar2 = 0;
  uVar3 = CONCAT44(in_register_0000003c,__fd);
  do {
    *(byte *)((long)__buf + lVar2) = (0x7f < uVar3) << 7 | (byte)uVar3 & 0x7f;
    lVar2 = lVar2 + 1;
    bVar1 = 0x7f < uVar3;
    uVar3 = uVar3 >> 7;
  } while (bVar1);
  return lVar2;
}

Assistant:

static int write( UInt x, Buffer & bytes ) {
        assert( x >= 0 );
        int i = 0;
        do {
            unsigned char m = (1 << (CHAR_BIT-1));
            unsigned char c = x & (m-1); // cut out least significant bits
            x >>= (CHAR_BIT-1);          // and save these in c
            c |= (x > 0) * m ;  // set highest signif. bit if continuing
            bytes[i++] = c;
        } while ( x != 0 );
        return i;
    }